

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.cpp
# Opt level: O3

void __thiscall Assimp::Blender::DNAParser::Parse(DNAParser *this)

{
  pointer out;
  FileDatabase *pFVar1;
  pointer pSVar2;
  pointer pSVar3;
  pointer pFVar4;
  char *pcVar5;
  pointer pFVar6;
  pointer pFVar7;
  pointer pTVar8;
  pointer pbVar9;
  bool bVar10;
  char cVar11;
  short sVar12;
  ushort uVar13;
  int iVar14;
  mapped_type_conflict3 *pmVar15;
  long lVar16;
  size_type sVar17;
  Logger *this_00;
  runtime_error *prVar18;
  ulong uVar19;
  ulong uVar20;
  Type *s;
  pointer pbVar21;
  pointer pTVar22;
  StreamReaderAny *stream;
  ulong uVar23;
  size_t sVar24;
  vector<Type,_std::allocator<Type>_> types;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  vector<Type,_std::allocator<Type>_> local_248;
  long *local_230 [2];
  long local_220 [2];
  DNA *local_210;
  long local_208;
  size_type local_200;
  StreamReaderAny *local_1f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f0;
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  _Alloc_hider local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  size_t local_168 [33];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *local_60;
  size_type local_58;
  vector<Assimp::Blender::Structure> *local_50;
  DNAParser *local_48;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *local_40;
  vector<Assimp::Blender::Field> *local_38;
  
  pFVar1 = this->db;
  stream = (pFVar1->reader).
           super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_48 = this;
  bVar10 = match4(stream,"SDNA");
  if (!bVar10) {
    prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1d8._0_8_ = local_1d8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d8,"BlenderDNA: Expected SDNA chunk","");
    ::std::runtime_error::runtime_error(prVar18,(string *)local_1d8);
    *(undefined ***)prVar18 = &PTR__runtime_error_007dd738;
    __cxa_throw(prVar18,&DeadlyImportError::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar10 = match4(stream,"NAME");
  if (!bVar10) {
    prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1d8._0_8_ = local_1d8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d8,"BlenderDNA: Expected NAME field","");
    ::std::runtime_error::runtime_error(prVar18,(string *)local_1d8);
    *(undefined ***)prVar18 = &PTR__runtime_error_007dd738;
    __cxa_throw(prVar18,&DeadlyImportError::typeinfo,::std::runtime_error::~runtime_error);
  }
  iVar14 = StreamReader<true,_true>::Get<int>(stream);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1f0,(long)iVar14,(allocator_type *)local_1d8);
  pbVar9 = local_1f0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_210 = &pFVar1->dna;
  for (pbVar21 = local_1f0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar21 != pbVar9; pbVar21 = pbVar21 + 1
      ) {
    while (cVar11 = StreamReader<true,_true>::Get<signed_char>(stream), cVar11 != '\0') {
      ::std::__cxx11::string::push_back((char)pbVar21);
    }
  }
  while ((*(int *)&stream->current - *(int *)&stream->buffer & 3U) != 0) {
    StreamReader<true,_true>::Get<signed_char>(stream);
  }
  bVar10 = match4(stream,"TYPE");
  if (!bVar10) {
    prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1d8._0_8_ = local_1d8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d8,"BlenderDNA: Expected TYPE field","");
    ::std::runtime_error::runtime_error(prVar18,(string *)local_1d8);
    *(undefined ***)prVar18 = &PTR__runtime_error_007dd738;
    __cxa_throw(prVar18,&DeadlyImportError::typeinfo,::std::runtime_error::~runtime_error);
  }
  iVar14 = StreamReader<true,_true>::Get<int>(stream);
  ::std::vector<Type,_std::allocator<Type>_>::vector
            (&local_248,(long)iVar14,(allocator_type *)local_1d8);
  pTVar8 = local_248.super__Vector_base<Type,_std::allocator<Type>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  for (pTVar22 = local_248.super__Vector_base<Type,_std::allocator<Type>_>._M_impl.
                 super__Vector_impl_data._M_start; pTVar22 != pTVar8; pTVar22 = pTVar22 + 1) {
    while (cVar11 = StreamReader<true,_true>::Get<signed_char>(stream), cVar11 != '\0') {
      ::std::__cxx11::string::push_back((char)pTVar22 + '\b');
    }
  }
  while ((*(int *)&stream->current - *(int *)&stream->buffer & 3U) != 0) {
    StreamReader<true,_true>::Get<signed_char>(stream);
  }
  bVar10 = match4(stream,"TLEN");
  pTVar8 = local_248.super__Vector_base<Type,_std::allocator<Type>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  pTVar22 = local_248.super__Vector_base<Type,_std::allocator<Type>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (!bVar10) {
    prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1d8._0_8_ = local_1d8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d8,"BlenderDNA: Expected TLEN field","");
    ::std::runtime_error::runtime_error(prVar18,(string *)local_1d8);
    *(undefined ***)prVar18 = &PTR__runtime_error_007dd738;
    __cxa_throw(prVar18,&DeadlyImportError::typeinfo,::std::runtime_error::~runtime_error);
  }
  for (; pTVar22 != pTVar8; pTVar22 = pTVar22 + 1) {
    sVar12 = StreamReader<true,_true>::Get<short>(stream);
    pTVar22->size = (long)sVar12;
  }
  while ((*(int *)&stream->current - *(int *)&stream->buffer & 3U) != 0) {
    StreamReader<true,_true>::Get<signed_char>(stream);
  }
  bVar10 = match4(stream,"STRC");
  if (!bVar10) {
    prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1d8._0_8_ = local_1d8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d8,"BlenderDNA: Expected STRC field","");
    ::std::runtime_error::runtime_error(prVar18,(string *)local_1d8);
    *(undefined ***)prVar18 = &PTR__runtime_error_007dd738;
    __cxa_throw(prVar18,&DeadlyImportError::typeinfo,::std::runtime_error::~runtime_error);
  }
  iVar14 = StreamReader<true,_true>::Get<int>(stream);
  local_58 = (size_type)iVar14;
  local_50 = &(pFVar1->dna).structures;
  ::std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>::reserve
            (&local_50->
              super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>,
             local_58);
  if (iVar14 == 0) {
    local_208 = 0;
  }
  else {
    local_60 = &(pFVar1->dna).indices;
    sVar17 = 0;
    local_208 = 0;
    local_1f8 = stream;
    do {
      local_200 = sVar17;
      uVar13 = StreamReader<true,_true>::Get<short>(stream);
      uVar20 = (ulong)uVar13;
      uVar19 = ((long)local_248.super__Vector_base<Type,_std::allocator<Type>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_248.super__Vector_base<Type,_std::allocator<Type>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
      if (uVar19 < uVar20 || uVar19 - uVar20 == 0) {
        prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d8,"BlenderDNA: Invalid type index in structure name",0x30);
        ::std::ostream::_M_insert<unsigned_long>((ulong)local_1d8);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d8," (there are only ",0x11);
        ::std::ostream::_M_insert<unsigned_long>((ulong)local_1d8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8," entries)",9);
        ::std::__cxx11::stringbuf::str();
        ::std::runtime_error::runtime_error(prVar18,(string *)local_230);
        *(undefined ***)prVar18 = &PTR__runtime_error_007dd738;
        __cxa_throw(prVar18,&DeadlyImportError::typeinfo,::std::runtime_error::~runtime_error);
      }
      pSVar2 = (pFVar1->dna).structures.
               super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
               .
               super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar3 = (pFVar1->dna).structures.
               super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
               .
               super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pmVar15 = ::std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                ::operator[](local_60,&local_248.super__Vector_base<Type,_std::allocator<Type>_>.
                                       _M_impl.super__Vector_impl_data._M_start[uVar20].name);
      *pmVar15 = ((long)pSVar3 - (long)pSVar2 >> 3) * -0x1111111111111111;
      local_1d8._8_8_ = 0;
      local_1d8._16_8_ = local_1d8._16_8_ & 0xffffffffffffff00;
      local_1a8._0_8_ = (pointer)0x0;
      local_1b8._0_8_ = (pointer)0x0;
      local_1b8._8_8_ = (pointer)0x0;
      local_198._M_allocated_capacity = local_198._M_allocated_capacity & 0xffffffff00000000;
      local_198._8_8_ = 0;
      local_188._M_p = (pointer)&local_198;
      local_178._M_allocated_capacity = 0;
      local_168[0] = 0xffffffffffffffff;
      local_1d8._0_8_ = local_1d8 + 0x10;
      paStack_180 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_188._M_p;
      ::std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>::
      emplace_back<Assimp::Blender::Structure>
                (&local_50->
                  super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
                 ,(Structure *)local_1d8);
      ::std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                   *)(local_1a8 + 8));
      ::std::vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>::~vector
                ((vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_> *)
                 local_1b8);
      if ((undefined1 *)local_1d8._0_8_ != local_1d8 + 0x10) {
        operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
      }
      pSVar2 = (pFVar1->dna).structures.
               super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
               .
               super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      ::std::__cxx11::string::_M_assign((string *)(pSVar2 + -1));
      uVar13 = StreamReader<true,_true>::Get<short>(stream);
      local_38 = &pSVar2[-1].fields;
      uVar19 = (ulong)uVar13;
      ::std::vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>::reserve
                (&local_38->
                  super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>,
                 uVar19);
      if (uVar13 == 0) {
        sVar24 = 0;
      }
      else {
        local_40 = &pSVar2[-1].indices;
        local_208 = local_208 + uVar19;
        sVar24 = 0;
        do {
          uVar13 = StreamReader<true,_true>::Get<short>(stream);
          uVar23 = (ulong)uVar13;
          uVar20 = ((long)local_248.super__Vector_base<Type,_std::allocator<Type>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_248.super__Vector_base<Type,_std::allocator<Type>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
          if (uVar20 < uVar23 || uVar20 - uVar23 == 0) {
            prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1d8,"BlenderDNA: Invalid type index in structure field ",
                       0x32);
            ::std::ostream::_M_insert<unsigned_long>((ulong)local_1d8);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1d8," (there are only ",0x11);
            ::std::ostream::_M_insert<unsigned_long>((ulong)local_1d8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8," entries)",9)
            ;
            ::std::__cxx11::stringbuf::str();
            ::std::runtime_error::runtime_error(prVar18,(string *)local_230);
            *(undefined ***)prVar18 = &PTR__runtime_error_007dd738;
            __cxa_throw(prVar18,&DeadlyImportError::typeinfo,::std::runtime_error::~runtime_error);
          }
          local_188._M_p = (pointer)0x0;
          paStack_180 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0;
          local_198._M_allocated_capacity = 0;
          local_198._8_8_ = 0;
          local_1a8._8_8_ = 0;
          local_1b8._8_8_ = (pointer)0x0;
          local_1d8._16_8_ = 0;
          local_1d8._24_8_ = 0;
          local_178._M_allocated_capacity = 0;
          local_1d8._8_8_ = 0;
          local_1a8._0_8_ = (pointer)0x0;
          local_1d8._0_8_ = local_1d8 + 0x10;
          local_1b8._0_8_ = (pointer)local_1a8;
          ::std::vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>::
          emplace_back<Assimp::Blender::Field>
                    (&local_38->
                      super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>,
                     (Field *)local_1d8);
          if ((pointer)local_1b8._0_8_ != (pointer)local_1a8) {
            operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._0_8_ + 1));
          }
          if ((undefined1 *)local_1d8._0_8_ != local_1d8 + 0x10) {
            operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
          }
          pFVar4 = pSVar2[-1].fields.
                   super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>.
                   super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pFVar4[-1].offset = sVar24;
          ::std::__cxx11::string::_M_assign((string *)&pFVar4[-1].type);
          pFVar4[-1].size =
               local_248.super__Vector_base<Type,_std::allocator<Type>_>._M_impl.
               super__Vector_impl_data._M_start[uVar23].size;
          uVar13 = StreamReader<true,_true>::Get<short>(local_1f8);
          if ((ulong)((long)local_1f0.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_1f0.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) <= (ulong)uVar13) {
            prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1d8,"BlenderDNA: Invalid name index in structure field ",
                       0x32);
            ::std::ostream::_M_insert<unsigned_long>((ulong)local_1d8);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1d8," (there are only ",0x11);
            ::std::ostream::_M_insert<unsigned_long>((ulong)local_1d8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8," entries)",9)
            ;
            ::std::__cxx11::stringbuf::str();
            ::std::runtime_error::runtime_error(prVar18,(string *)local_230);
            *(undefined ***)prVar18 = &PTR__runtime_error_007dd738;
            __cxa_throw(prVar18,&DeadlyImportError::typeinfo,::std::runtime_error::~runtime_error);
          }
          out = pFVar4 + -1;
          ::std::__cxx11::string::_M_assign((string *)out);
          pFVar4[-1].flags = 0;
          pcVar5 = pFVar4[-1].name._M_dataplus._M_p;
          if (*pcVar5 == '*') {
            pFVar4[-1].size = (ulong)local_48->db->i64bit * 4 + 4;
            pFVar4[-1].flags = 1;
          }
          if (pcVar5[pFVar4[-1].name._M_string_length - 1] == ']') {
            lVar16 = ::std::__cxx11::string::find((char)out,0x5b);
            if (lVar16 == -1) {
              prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1d8,"BlenderDNA: Encountered invalid array declaration ",
                         0x32);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1d8,pFVar4[-1].name._M_dataplus._M_p,
                         pFVar4[-1].name._M_string_length);
              ::std::__cxx11::stringbuf::str();
              ::std::runtime_error::runtime_error(prVar18,(string *)local_230);
              *(undefined ***)prVar18 = &PTR__runtime_error_007dd738;
              __cxa_throw(prVar18,&DeadlyImportError::typeinfo,::std::runtime_error::~runtime_error)
              ;
            }
            *(byte *)&pFVar4[-1].flags = (byte)pFVar4[-1].flags | 2;
            DNA::ExtractArraySize(&out->name,pFVar4[-1].array_sizes);
            ::std::__cxx11::string::substr((ulong)local_1d8,(ulong)out);
            ::std::__cxx11::string::operator=((string *)out,(string *)local_1d8);
            if ((undefined1 *)local_1d8._0_8_ != local_1d8 + 0x10) {
              operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
            }
            pFVar4[-1].size =
                 pFVar4[-1].array_sizes[1] * pFVar4[-1].array_sizes[0] * pFVar4[-1].size;
          }
          pFVar6 = pSVar2[-1].fields.
                   super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>.
                   super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pFVar7 = pSVar2[-1].fields.
                   super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>.
                   super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pmVar15 = ::std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                    ::operator[](local_40,&out->name);
          *pmVar15 = ((long)pFVar7 - (long)pFVar6 >> 3) * 0x4ec4ec4ec4ec4ec5 - 1;
          sVar24 = sVar24 + pFVar4[-1].size;
          uVar19 = uVar19 - 1;
          stream = local_1f8;
        } while (uVar19 != 0);
      }
      pSVar2[-1].size = sVar24;
      sVar17 = local_200 + 1;
    } while (sVar17 != local_58);
  }
  this_00 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[17]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
             (char (*) [17])"BlenderDNA: Got ");
  ::std::ostream::_M_insert<unsigned_long>((ulong)local_1d8);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1d8," structures with totally ",0x19);
  ::std::ostream::_M_insert<unsigned_long>((ulong)local_1d8);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8," fields",7);
  ::std::__cxx11::stringbuf::str();
  Logger::debug(this_00,(char *)local_230[0]);
  if (local_230[0] != local_220) {
    operator_delete(local_230[0],local_220[0] + 1);
  }
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
  ::std::ios_base::~ios_base((ios_base *)local_168);
  DNA::DumpToFile(local_210);
  DNA::AddPrimitiveStructures(local_210);
  DNA::RegisterConverters(local_210);
  ::std::vector<Type,_std::allocator<Type>_>::~vector(&local_248);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1f0);
  return;
}

Assistant:

void DNAParser::Parse ()
{
    StreamReaderAny& stream = *db.reader.get();
    DNA& dna = db.dna;

    if(!match4(stream,"SDNA")) {
        throw DeadlyImportError("BlenderDNA: Expected SDNA chunk");
    }

    // name dictionary
    if(!match4(stream,"NAME")) {
        throw DeadlyImportError("BlenderDNA: Expected NAME field");
    }

    std::vector<std::string> names (stream.GetI4());
    for(std::string& s : names) {
        while (char c = stream.GetI1()) {
            s += c;
        }
    }

    // type dictionary
    for (;stream.GetCurrentPos() & 0x3; stream.GetI1());
    if(!match4(stream,"TYPE")) {
        throw DeadlyImportError("BlenderDNA: Expected TYPE field");
    }

    std::vector<Type> types (stream.GetI4());
    for(Type& s : types) {
        while (char c = stream.GetI1()) {
            s.name += c;
        }
    }

    // type length dictionary
    for (;stream.GetCurrentPos() & 0x3; stream.GetI1());
    if(!match4(stream,"TLEN")) {
        throw DeadlyImportError("BlenderDNA: Expected TLEN field");
    }

    for(Type& s : types) {
        s.size = stream.GetI2();
    }

    // structures dictionary
    for (;stream.GetCurrentPos() & 0x3; stream.GetI1());
    if(!match4(stream,"STRC")) {
        throw DeadlyImportError("BlenderDNA: Expected STRC field");
    }

    size_t end = stream.GetI4(), fields = 0;

    dna.structures.reserve(end);
    for(size_t i = 0; i != end; ++i) {

        uint16_t n = stream.GetI2();
        if (n >= types.size()) {
            throw DeadlyImportError((format(),
                "BlenderDNA: Invalid type index in structure name" ,n,
                " (there are only ", types.size(), " entries)"
            ));
        }

        // maintain separate indexes
        dna.indices[types[n].name] = dna.structures.size();

        dna.structures.push_back(Structure());
        Structure& s = dna.structures.back();
        s.name  = types[n].name;
        //s.index = dna.structures.size()-1;

        n = stream.GetI2();
        s.fields.reserve(n);

        size_t offset = 0;
        for (size_t m = 0; m < n; ++m, ++fields) {

            uint16_t j = stream.GetI2();
            if (j >= types.size()) {
                throw DeadlyImportError((format(),
                    "BlenderDNA: Invalid type index in structure field ", j,
                    " (there are only ", types.size(), " entries)"
                ));
            }
            s.fields.push_back(Field());
            Field& f = s.fields.back();
            f.offset = offset;

            f.type = types[j].name;
            f.size = types[j].size;

            j = stream.GetI2();
            if (j >= names.size()) {
                throw DeadlyImportError((format(),
                    "BlenderDNA: Invalid name index in structure field ", j,
                    " (there are only ", names.size(), " entries)"
                ));
            }

            f.name = names[j];
            f.flags = 0u;

            // pointers always specify the size of the pointee instead of their own.
            // The pointer asterisk remains a property of the lookup name.
            if (f.name[0] == '*') {
                f.size = db.i64bit ? 8 : 4;
                f.flags |= FieldFlag_Pointer;
            }

            // arrays, however, specify the size of a single element so we
            // need to parse the (possibly multi-dimensional) array declaration
            // in order to obtain the actual size of the array in the file.
            // Also we need to alter the lookup name to include no array
            // brackets anymore or size fixup won't work (if our size does
            // not match the size read from the DNA).
            if (*f.name.rbegin() == ']') {
                const std::string::size_type rb = f.name.find('[');
                if (rb == std::string::npos) {
                    throw DeadlyImportError((format(),
                        "BlenderDNA: Encountered invalid array declaration ",
                        f.name
                    ));
                }

                f.flags |= FieldFlag_Array;
                DNA::ExtractArraySize(f.name,f.array_sizes);
                f.name = f.name.substr(0,rb);

                f.size *= f.array_sizes[0] * f.array_sizes[1];
            }

            // maintain separate indexes
            s.indices[f.name] = s.fields.size()-1;
            offset += f.size;
        }
        s.size = offset;
    }

    ASSIMP_LOG_DEBUG_F( "BlenderDNA: Got ", dna.structures.size()," structures with totally ",fields," fields");

#ifdef ASSIMP_BUILD_BLENDER_DEBUG
    dna.DumpToFile();
#endif

    dna.AddPrimitiveStructures();
    dna.RegisterConverters();
}